

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

ParamGenerator<bool>
bssl::anon_unknown_0::gtest_AllParseCertificatePoliciesExtensionOidsTest_EvalGenerator_(void)

{
  element_type *in_RDI;
  ParamGenerator<bool> PVar1;
  
  PVar1 = testing::Bool();
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<bool>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, InvalidEmpty) {
  std::string der;
  ASSERT_TRUE(LoadTestData("invalid-empty.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
}